

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cpp
# Opt level: O2

void __thiscall Generator_odeConstantOnRhs_Test::TestBody(Generator_odeConstantOnRhs_Test *this)

{
  char *pcVar1;
  unsigned_long local_e0 [4];
  AssertionResult gtest_ar;
  allocator<char> local_99;
  GeneratorProfilePtr profile;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  AssertionResult gtest_ar_4;
  GeneratorPtr generator;
  AnalyserPtr analyser;
  AnalyserModelPtr analyserModel;
  ModelPtr model;
  ParserPtr parser;
  
  libcellml::Parser::create(SUB81(&parser,0));
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_e0,"generator/ode_constant_on_rhs/model.cellml",
             (allocator<char> *)&local_88);
  fileContents((string *)&gtest_ar);
  libcellml::Parser::parseModel((string *)&model);
  std::__cxx11::string::~string((string *)&gtest_ar);
  std::__cxx11::string::~string((string *)local_e0);
  local_e0[0] = 0;
  local_88._M_dataplus._M_p = (pointer)libcellml::Logger::issueCount();
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&gtest_ar,"size_t(0)","parser->issueCount()",local_e0,
             (unsigned_long *)&local_88);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)local_e0);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/generator/generator.cpp"
               ,0x260,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_88,(Message *)local_e0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_88);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_e0);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  libcellml::Analyser::create();
  libcellml::Analyser::analyseModel
            ((shared_ptr *)
             analyser.super___shared_ptr<libcellml::Analyser,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  local_e0[0] = 0;
  local_88._M_dataplus._M_p = (pointer)libcellml::Logger::errorCount();
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&gtest_ar,"size_t(0)","analyser->errorCount()",local_e0,
             (unsigned_long *)&local_88);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)local_e0);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/generator/generator.cpp"
               ,0x266,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_88,(Message *)local_e0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_88);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_e0);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  libcellml::Analyser::model();
  libcellml::Generator::create();
  libcellml::Generator::setModel
            ((shared_ptr *)
             generator.super___shared_ptr<libcellml::Generator,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_e0,"generator/ode_constant_on_rhs/model.h",
             (allocator<char> *)&gtest_ar_4);
  fileContents((string *)&gtest_ar);
  libcellml::Generator::interfaceCode_abi_cxx11_();
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)&profile,"fileContents(\"generator/ode_constant_on_rhs/model.h\")",
             "generator->interfaceCode()",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar,
             &local_88);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&gtest_ar);
  std::__cxx11::string::~string((string *)local_e0);
  if ((char)profile.super___shared_ptr<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr == '\0') {
    testing::Message::Message((Message *)&gtest_ar);
    if (profile.super___shared_ptr<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = *(char **)profile.
                         super___shared_ptr<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount._M_pi;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/generator/generator.cpp"
               ,0x26d,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_e0,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_e0);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&profile.
                  super___shared_ptr<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_e0,"generator/ode_constant_on_rhs/model.c",
             (allocator<char> *)&gtest_ar_4);
  fileContents((string *)&gtest_ar);
  libcellml::Generator::implementationCode_abi_cxx11_();
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)&profile,"fileContents(\"generator/ode_constant_on_rhs/model.c\")",
             "generator->implementationCode()",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar,
             &local_88);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&gtest_ar);
  std::__cxx11::string::~string((string *)local_e0);
  if ((char)profile.super___shared_ptr<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr == '\0') {
    testing::Message::Message((Message *)&gtest_ar);
    if (profile.super___shared_ptr<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = *(char **)profile.
                         super___shared_ptr<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount._M_pi;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/generator/generator.cpp"
               ,0x26e,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_e0,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_e0);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&profile.
                  super___shared_ptr<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
  libcellml::GeneratorProfile::create((Profile)&profile);
  libcellml::Generator::setProfile
            ((shared_ptr *)
             generator.super___shared_ptr<libcellml::Generator,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_e0,"generator/ode_constant_on_rhs/model.py",&local_99);
  fileContents((string *)&gtest_ar);
  libcellml::Generator::implementationCode_abi_cxx11_();
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)&gtest_ar_4,"fileContents(\"generator/ode_constant_on_rhs/model.py\")",
             "generator->implementationCode()",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar,
             &local_88);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&gtest_ar);
  std::__cxx11::string::~string((string *)local_e0);
  if (gtest_ar_4.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar);
    if (gtest_ar_4.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar_4.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/generator/generator.cpp"
               ,0x274,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_e0,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_e0);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_4.message_);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&profile.super___shared_ptr<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&generator.super___shared_ptr<libcellml::Generator,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&analyserModel.super___shared_ptr<libcellml::AnalyserModel,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&analyser.super___shared_ptr<libcellml::Analyser,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&parser.super___shared_ptr<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

TEST(Generator, odeConstantOnRhs)
{
    auto parser = libcellml::Parser::create();
    auto model = parser->parseModel(fileContents("generator/ode_constant_on_rhs/model.cellml"));

    EXPECT_EQ(size_t(0), parser->issueCount());

    auto analyser = libcellml::Analyser::create();

    analyser->analyseModel(model);

    EXPECT_EQ(size_t(0), analyser->errorCount());

    auto analyserModel = analyser->model();
    auto generator = libcellml::Generator::create();

    generator->setModel(analyserModel);

    EXPECT_EQ(fileContents("generator/ode_constant_on_rhs/model.h"), generator->interfaceCode());
    EXPECT_EQ(fileContents("generator/ode_constant_on_rhs/model.c"), generator->implementationCode());

    auto profile = libcellml::GeneratorProfile::create(libcellml::GeneratorProfile::Profile::PYTHON);

    generator->setProfile(profile);

    EXPECT_EQ(fileContents("generator/ode_constant_on_rhs/model.py"), generator->implementationCode());
}